

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O0

JsValueRef
Debugger::GetSource(JsValueRef callee,bool isConstructCall,JsValueRef *arguments,
                   unsigned_short argumentCount,void *callbackState)

{
  JsErrorCode JVar1;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  JsErrorCode jsErrorCode_1;
  JsErrorCode jsErrorCode;
  JsValueRef source;
  void *pvStack_38;
  int scriptId;
  void *callbackState_local;
  JsValueRef *ppvStack_28;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_18;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  _jsErrorCode_1 = (JsValueRef)0x0;
  if (1 < argumentCount) {
    pvStack_38 = callbackState;
    callbackState_local._6_2_ = argumentCount;
    ppvStack_28 = arguments;
    arguments_local._7_1_ = isConstructCall;
    pvStack_18 = callee;
    JVar1 = ChakraRTInterface::JsNumberToInt(arguments[1],(int *)((long)&source + 4));
    if (JVar1 != JsNoError) {
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar2,
                   L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[1], &scriptId) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      return (JsValueRef)0x0;
    }
    JVar1 = ChakraRTInterface::JsDiagGetSource(source._4_4_,(JsValueRef *)&jsErrorCode_1);
    if (JVar1 != JsNoError) {
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar2,
                   L"ERROR: ChakraRTInterface::JsDiagGetSource(scriptId, &source) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      return (JsValueRef)0x0;
    }
  }
  return _jsErrorCode_1;
}

Assistant:

JsValueRef Debugger::GetSource(JsValueRef callee, bool isConstructCall, JsValueRef * arguments, unsigned short argumentCount, void * callbackState)
{
    int scriptId;
    JsValueRef source = JS_INVALID_REFERENCE;

    if (argumentCount > 1)
    {
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[1], &scriptId));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsDiagGetSource(scriptId, &source));
    }

    return source;
}